

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matfx.cpp
# Opt level: O2

int32 rw::getSizeMaterialMatFX(void *object,int32 offset,int32 param_3)

{
  int iVar1;
  long lVar2;
  uint32 uVar3;
  int32 iVar4;
  Texture *pTVar5;
  long lVar6;
  
  lVar2 = *(long *)((long)object + (long)offset);
  if (lVar2 == 0) {
    iVar4 = -1;
  }
  else {
    iVar4 = 0xc;
    for (lVar6 = 0x18; lVar6 != 0x68; lVar6 = lVar6 + 0x28) {
      iVar1 = *(int *)(lVar2 + -0x18 + lVar6);
      if (iVar1 == 4) {
        pTVar5 = *(Texture **)(lVar2 + -0x10 + lVar6);
LAB_0012ac6e:
        if (pTVar5 == (Texture *)0x0) {
          iVar4 = iVar4 + 0xc;
        }
        else {
          uVar3 = Texture::streamGetSize(pTVar5);
          iVar4 = iVar4 + uVar3 + 0x18;
        }
      }
      else {
        if (iVar1 == 2) {
          pTVar5 = *(Texture **)(lVar2 + -8 + lVar6);
          goto LAB_0012ac6e;
        }
        if (iVar1 == 1) {
          pTVar5 = *(Texture **)(lVar2 + -8 + lVar6);
          if (pTVar5 == (Texture *)0x0) {
            iVar4 = iVar4 + 0xc;
          }
          else {
            uVar3 = Texture::streamGetSize(pTVar5);
            iVar4 = iVar4 + uVar3 + 0x18;
          }
          if (*(Texture **)(lVar2 + lVar6) != (Texture *)0x0) {
            uVar3 = Texture::streamGetSize(*(Texture **)(lVar2 + lVar6));
            iVar4 = iVar4 + uVar3 + 0xc;
          }
        }
      }
    }
  }
  return iVar4;
}

Assistant:

static int32
getSizeMaterialMatFX(void *object, int32 offset, int32)
{
	MatFX *matfx = *PLUGINOFFSET(MatFX*, object, offset);
	if(matfx == nil)
		return -1;
	int32 size = 4 + 4 + 4;

	for(int i = 0; i < 2; i++){
		switch(matfx->fx[i].type){
		case MatFX::BUMPMAP:
			size += 4 + 4 + 4;
			if(matfx->fx[i].bump.bumpedTex)
				size += 12 +
				  matfx->fx[i].bump.bumpedTex->streamGetSize();
			if(matfx->fx[i].bump.tex)
				size += 12 +
				  matfx->fx[i].bump.tex->streamGetSize();
			break;

		case MatFX::ENVMAP:
			size += 4 + 4 + 4;
			if(matfx->fx[i].env.tex)
				size += 12 +
				  matfx->fx[i].env.tex->streamGetSize();
			break;

		case MatFX::DUAL:
			size += 4 + 4 + 4;
			if(matfx->fx[i].dual.tex)
				size += 12 +
				  matfx->fx[i].dual.tex->streamGetSize();
			break;
		}
	}
	return size;
}